

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O1

Maybe<kj::Url> *
kj::Url::tryParse(Maybe<kj::Url> *__return_storage_ptr__,StringPtr text,Context context,
                 Options options)

{
  anon_unknown_0 *paVar1;
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  undefined8 uVar5;
  char *c;
  void *pvVar7;
  byte *pbVar8;
  long lVar9;
  anon_unknown_0 *paVar10;
  byte *pbVar11;
  char *pcVar12;
  char *pcVar13;
  Maybe<kj::Url> *pMVar14;
  short *__s;
  size_t sVar15;
  char *pcVar16;
  Options *pOVar17;
  long lVar18;
  Options *pOVar19;
  Options *in_R9;
  char *pcVar20;
  bool bVar21;
  bool bVar22;
  ArrayPtr<const_char> AVar23;
  ArrayPtr<const_char> AVar24;
  ArrayPtr<const_char> text_00;
  ArrayPtr<const_char> text_01;
  ArrayPtr<const_char> text_02;
  ArrayPtr<const_char> text_03;
  ArrayPtr<const_char> text_04;
  ArrayPtr<const_char> text_05;
  ArrayPtr<const_char> text_06;
  ArrayPtr<const_char> text_07;
  ArrayPtr<const_char> text_08;
  bool err;
  String result;
  Fault f;
  char local_19b;
  Options local_19a;
  StringPtr local_198;
  undefined1 local_188 [24];
  undefined1 local_170 [8];
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 aStack_168;
  Maybe<kj::Url> *local_148;
  char *local_140;
  String local_138;
  CharGroup_ *local_120;
  Url local_118;
  char *local_38;
  anon_unknown_0 *paVar6;
  
  sVar15 = text.content.size_;
  __s = (short *)text.content.ptr;
  local_118.scheme.content.disposer._0_1_ = 0;
  local_118.scheme.content.disposer._1_7_ = 0;
  local_118.userInfo.ptr.isSet = false;
  local_118.scheme.content.ptr = (char *)0x0;
  local_118.scheme.content.size_._0_1_ = 0;
  local_118.scheme.content.size_._1_7_ = 0;
  local_118.host.content.ptr = (char *)0x0;
  local_118.host.content.size_ = 0;
  local_118.host.content.disposer = (ArrayDisposer *)0x0;
  local_118.path.builder.ptr = (String *)0x0;
  local_118.path.builder.pos = (String *)0x0;
  local_118.path.builder.endPtr = (String *)0x0;
  local_118.path.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_118.hasTrailingSlash = false;
  local_118.query.builder.ptr = (QueryParam *)0x0;
  local_118.query.builder.pos = (QueryParam *)0x0;
  local_118.query.builder.endPtr = (QueryParam *)0x0;
  local_118.query.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_118.fragment.ptr.isSet = false;
  local_19b = '\0';
  local_19a = options;
  local_198.content.ptr = (char *)__s;
  local_198.content.size_ = sVar15;
  local_148 = __return_storage_ptr__;
  local_118.options = options;
  if (HTTP_REQUEST < context) {
    kj::_::unreachable();
  }
  local_120 = (CharGroup_ *)&DAT_005b62a8;
  pcVar20 = (char *)(long)*(int *)(&DAT_005b62a8 + (ulong)context * 4);
  if (context == HTTP_REQUEST) {
    if ((sVar15 != 1) &&
       (pcVar12 = (char *)(long)*(int *)(&DAT_005b629c + (ulong)context * 4), (char)*__s == '/')) {
LAB_0046f1d6:
      if (local_198.content.size_ != 1) {
        local_120 = (CharGroup_ *)(pcVar20 + (long)local_120->bits);
        paVar10 = (anon_unknown_0 *)&local_198;
        do {
          if (*local_198.content.ptr != '/') {
            if (*local_198.content.ptr == '?') goto LAB_0046f567;
            break;
          }
          local_198.content.ptr = (char *)((long)local_198.content.ptr + 1);
          local_198.content.size_ = local_198.content.size_ - 1;
          AVar23 = anon_unknown_0::split((StringPtr *)paVar10,(CharGroup_ *)(pcVar12 + 0x5b629c));
          text_00.ptr = (char *)AVar23.size_;
          paVar6 = (anon_unknown_0 *)AVar23.ptr;
          if (text_00.ptr == (char *)0x0) {
            bVar21 = true;
            if ((local_19a.allowEmpty == true) && (local_198.content.size_ != 1)) goto LAB_0046f2a4;
          }
          else if (text_00.ptr == (char *)0x1) {
            bVar21 = true;
            if (*paVar6 != (anon_unknown_0)0x2e) goto LAB_0046f2a4;
          }
          else if (((text_00.ptr == (char *)0x2) && (*paVar6 == (anon_unknown_0)0x2e)) &&
                  (paVar6[1] == (anon_unknown_0)0x2e)) {
            bVar21 = true;
            if (local_118.path.builder.pos != local_118.path.builder.ptr) {
              ArrayBuilder<kj::String>::removeLast(&local_118.path.builder);
            }
          }
          else {
LAB_0046f2a4:
            text_00.size_ = (size_t)&local_19b;
            anon_unknown_0::percentDecode
                      ((String *)local_188,paVar6,text_00,&local_19a.percentDecode,in_R9);
            if (local_118.path.builder.pos == local_118.path.builder.endPtr) {
              sVar15 = ((long)local_118.path.builder.endPtr - (long)local_118.path.builder.ptr >> 3)
                       * 0x5555555555555556;
              if (local_118.path.builder.endPtr == local_118.path.builder.ptr) {
                sVar15 = 4;
              }
              Vector<kj::String>::setCapacity(&local_118.path,sVar15);
            }
            ((local_118.path.builder.pos)->content).ptr = (char *)local_188._0_8_;
            ((local_118.path.builder.pos)->content).size_ = local_188._8_8_;
            ((local_118.path.builder.pos)->content).disposer = (ArrayDisposer *)local_188._16_8_;
            local_118.path.builder.pos = local_118.path.builder.pos + 1;
            bVar21 = false;
          }
          local_118.hasTrailingSlash = bVar21;
        } while (local_198.content.size_ != 1);
      }
      goto LAB_0046f80c;
    }
  }
  else {
    local_140 = (char *)(long)*(int *)(&DAT_005b629c + (ulong)context * 4);
    local_38 = pcVar20;
    pvVar7 = memchr(__s,0x3a,sVar15 - 1);
    if (pvVar7 == (void *)0x0) {
      (local_148->ptr).isSet = false;
    }
    else {
      pcVar20 = (char *)((long)pvVar7 - (long)__s);
      local_198.content.ptr = (char *)((long)pvVar7 + 1);
      local_198.content.size_ = ~(ulong)pcVar20 + sVar15;
      heapString((String *)local_188,(size_t)pcVar20);
      if (pcVar20 != (char *)0x0) {
        pbVar11 = (byte *)local_188._8_8_;
        if ((byte *)local_188._8_8_ != (byte *)0x0) {
          pbVar11 = (byte *)local_188._0_8_;
        }
        memcpy(pbVar11,__s,(size_t)pcVar20);
      }
      pcVar12 = local_118.scheme.content.ptr;
      if ((byte *)local_118.scheme.content.ptr != (byte *)0x0) {
        uVar2 = CONCAT71(local_118.scheme.content.size_._1_7_,
                         (undefined1)local_118.scheme.content.size_);
        local_118.scheme.content.ptr = (char *)0x0;
        local_118.scheme.content.size_._0_1_ = 0;
        local_118.scheme.content.size_._1_7_ = 0;
        in_R9 = (Options *)0x0;
        (*(code *)**(undefined8 **)
                    CONCAT71(local_118.scheme.content.disposer._1_7_,
                             local_118.scheme.content.disposer._0_1_))
                  ((undefined8 *)
                   CONCAT71(local_118.scheme.content.disposer._1_7_,
                            local_118.scheme.content.disposer._0_1_),pcVar12,1,uVar2,uVar2);
      }
      local_118.scheme.content.ptr = (char *)local_188._0_8_;
      local_118.scheme.content.size_._0_1_ = (undefined1)local_188._8_8_;
      local_118.scheme.content.size_._1_7_ = SUB87(local_188._8_8_,1);
      local_118.scheme.content.disposer._0_1_ = (undefined1)local_188._16_8_;
      local_118.scheme.content.disposer._1_7_ = SUB87(local_188._16_8_,1);
    }
    pMVar14 = local_148;
    if (pvVar7 == (void *)0x0) goto LAB_0046f8f6;
    pbVar11 = (byte *)(local_118.scheme.content.ptr +
                      CONCAT71(local_118.scheme.content.size_._1_7_,
                               (undefined1)local_118.scheme.content.size_) + -1);
    pbVar8 = (byte *)local_118.scheme.content.ptr;
    if (CONCAT71(local_118.scheme.content.size_._1_7_,(undefined1)local_118.scheme.content.size_) ==
        0) {
      pbVar8 = (byte *)0x0;
      pbVar11 = (byte *)0x0;
    }
    for (; pbVar8 != pbVar11; pbVar8 = pbVar8 + 1) {
      if ((byte)(*pbVar8 + 0xbf) < 0x1a) {
        *pbVar8 = *pbVar8 | 0x20;
      }
    }
    uVar3 = CONCAT71(local_118.scheme.content.size_._1_7_,(undefined1)local_118.scheme.content.size_
                    );
    if ((1 < uVar3) &&
       ((*(ulong *)(kj::(anonymous_namespace)::ALPHAS +
                   (ulong)((byte)*local_118.scheme.content.ptr >> 6) * 8) >>
         ((ulong)(byte)*local_118.scheme.content.ptr & 0x3f) & 1) != 0)) {
      lVar9 = uVar3 + (uVar3 == 0);
      bVar21 = lVar9 == 2;
      if ((!bVar21) &&
         ((*(ulong *)(kj::(anonymous_namespace)::SCHEME_CHARS +
                     (ulong)((byte)local_118.scheme.content.ptr[1] >> 6) * 8) >>
           ((ulong)(byte)local_118.scheme.content.ptr[1] & 0x3f) & 1) != 0)) {
        lVar18 = 0;
        do {
          bVar21 = lVar9 + -3 == lVar18;
          if (bVar21) break;
          lVar4 = lVar18 + 2;
          in_R9 = *(Options **)
                   (kj::(anonymous_namespace)::SCHEME_CHARS +
                   (ulong)((byte)local_118.scheme.content.ptr[lVar4] >> 6) * 8);
          lVar18 = lVar18 + 1;
        } while (((ulong)in_R9 >> ((ulong)(byte)local_118.scheme.content.ptr[lVar4] & 0x3f) & 1) !=
                 0);
      }
      if (((bVar21) && (1 < local_198.content.size_ - 1)) &&
         (*(short *)local_198.content.ptr == 0x2f2f)) {
        local_198.content.ptr = (char *)((long)local_198.content.ptr + 2);
        local_198.content.size_ = local_198.content.size_ - 2;
        AVar23 = anon_unknown_0::split
                           (&local_198,(CharGroup_ *)kj::(anonymous_namespace)::END_AUTHORITY);
        pcVar13 = (char *)AVar23.size_;
        paVar10 = (anon_unknown_0 *)AVar23.ptr;
        pcVar12 = pcVar13;
        if (pcVar13 == (char *)0x0) {
LAB_0046f960:
          bVar21 = false;
        }
        else {
          if (*paVar10 == (anon_unknown_0)0x40) {
            bVar21 = true;
            pcVar20 = (char *)0x0;
          }
          else {
            pcVar12 = pcVar13 + -1;
            pcVar16 = (char *)0x0;
            do {
              bVar21 = pcVar12 != pcVar16;
              if (pcVar12 == pcVar16) goto LAB_0046f960;
              pcVar20 = pcVar16 + 1;
              paVar6 = paVar10 + 1 + (long)pcVar16;
              pcVar16 = pcVar20;
            } while (*paVar6 != (anon_unknown_0)0x40);
          }
          pcVar12 = pcVar20 + 1;
          AVar23.size_ = (long)pcVar13 - (long)pcVar12;
          AVar23.ptr = (char *)(paVar10 + (long)pcVar20 + 1);
        }
        if (bVar21) {
          if (context == REMOTE_HREF) {
            if (pcVar20 == (char *)0x0) {
LAB_0046f9bd:
              bVar21 = false;
              paVar6 = paVar10;
            }
            else {
              if (*paVar10 == (anon_unknown_0)0x3a) {
                bVar21 = true;
                pcVar12 = (char *)0x0;
              }
              else {
                pcVar13 = (char *)0x0;
                do {
                  bVar21 = pcVar20 + -1 != pcVar13;
                  if (pcVar20 + -1 == pcVar13) goto LAB_0046f9bd;
                  pcVar12 = pcVar13 + 1;
                  paVar6 = paVar10 + 1 + (long)pcVar13;
                  pcVar13 = pcVar12;
                } while (*paVar6 != (anon_unknown_0)0x3a);
              }
              pcVar20 = pcVar20 + -(long)(pcVar12 + 1);
              paVar6 = paVar10 + (long)pcVar12 + 1;
            }
            if (bVar21) {
              text_05.size_ = (size_t)&local_19b;
              text_05.ptr = pcVar12;
              anon_unknown_0::percentDecode
                        ((String *)local_188,paVar10,text_05,&local_19a.percentDecode,in_R9);
              text_06.size_ = (size_t)&local_19b;
              text_06.ptr = pcVar20;
              anon_unknown_0::percentDecode
                        (&local_138,paVar6,text_06,&local_19a.percentDecode,in_R9);
              local_170[0] = 1;
              aStack_168.value.content.ptr = local_138.content.ptr;
              aStack_168.value.content.size_ = local_138.content.size_;
              aStack_168.value.content.disposer = local_138.content.disposer;
              local_138.content.ptr = (char *)0x0;
              local_138.content.size_ = 0;
              kj::_::NullableValue<kj::Url::UserInfo>::emplace<kj::Url::UserInfo>
                        (&local_118.userInfo.ptr,(UserInfo *)local_188);
              UserInfo::~UserInfo((UserInfo *)local_188);
              String::~String(&local_138);
            }
            else {
              text_07.size_ = (size_t)&local_19b;
              text_07.ptr = pcVar20;
              anon_unknown_0::percentDecode
                        ((String *)local_188,paVar6,text_07,&local_19a.percentDecode,in_R9);
              local_170 = (undefined1  [8])((ulong)local_170 & 0xffffffffffffff00);
              kj::_::NullableValue<kj::Url::UserInfo>::emplace<kj::Url::UserInfo>
                        (&local_118.userInfo.ptr,(UserInfo *)local_188);
              UserInfo::~UserInfo((UserInfo *)local_188);
            }
          }
          else {
            (local_148->ptr).isSet = false;
          }
          pMVar14 = local_148;
          if (context != REMOTE_HREF) goto LAB_0046f8f6;
        }
        text_08.size_ = (size_t)&local_19b;
        text_08.ptr = (char *)AVar23.size_;
        anon_unknown_0::percentDecode
                  ((String *)local_188,(anon_unknown_0 *)AVar23.ptr,text_08,&local_19a.percentDecode
                   ,in_R9);
        sVar15 = local_118.host.content.size_;
        pcVar20 = local_118.host.content.ptr;
        if ((byte *)local_118.host.content.ptr != (byte *)0x0) {
          local_118.host.content.ptr = (char *)0x0;
          local_118.host.content.size_ = 0;
          in_R9 = (Options *)0x0;
          (**(local_118.host.content.disposer)->_vptr_ArrayDisposer)
                    (local_118.host.content.disposer,pcVar20,1,sVar15,sVar15);
        }
        local_118.host.content.ptr = (char *)local_188._0_8_;
        local_118.host.content.size_ = local_188._8_8_;
        local_118.host.content.disposer = (ArrayDisposer *)local_188._16_8_;
        local_188._0_8_ = (byte *)0x0;
        local_188._8_8_ = (byte *)0x0;
        String::~String((String *)local_188);
        pbVar11 = (byte *)local_118.host.content.ptr;
        if ((byte *)local_118.host.content.size_ == (byte *)0x0) {
          pbVar11 = (byte *)0x0;
        }
        bVar21 = (byte *)local_118.host.content.size_ == (byte *)0x0;
        pOVar19 = (Options *)(local_118.host.content.size_ + -1);
        pOVar17 = (Options *)0x0;
        if (!bVar21) {
          pOVar17 = pOVar19;
        }
        bVar22 = bVar21 || pOVar19 == (Options *)0x0;
        if ((!bVar21 && pOVar19 != (Options *)0x0) &&
           (in_R9 = (Options *)(ulong)*pbVar11,
           (*(ulong *)(kj::(anonymous_namespace)::HOST_CHARS + (ulong)(*pbVar11 >> 6) * 8) >>
            ((ulong)in_R9 & 0x3f) & 1) != 0)) {
          in_R9 = (Options *)0x1;
          do {
            bVar22 = pOVar17 == in_R9;
            if (bVar22) break;
            pbVar8 = pbVar11 + (long)in_R9;
            in_R9 = (Options *)&in_R9->allowEmpty;
          } while ((*(ulong *)(kj::(anonymous_namespace)::HOST_CHARS + (ulong)(*pbVar8 >> 6) * 8) >>
                    ((ulong)*pbVar8 & 0x3f) & 1) != 0);
        }
        if (bVar22) {
          pbVar8 = (byte *)(local_118.host.content.ptr + -1 + local_118.host.content.size_);
          if ((byte *)local_118.host.content.size_ == (byte *)0x0) {
            pbVar8 = (byte *)0x0;
          }
          for (; pcVar12 = local_140, pcVar20 = local_38, pbVar11 != pbVar8; pbVar11 = pbVar11 + 1)
          {
            if ((byte)(*pbVar11 + 0xbf) < 0x1a) {
              *pbVar11 = *pbVar11 | 0x20;
            }
          }
          goto LAB_0046f1d6;
        }
      }
    }
  }
  goto LAB_0046f8ee;
  while ((local_198.content.size_ != 1 && (*local_198.content.ptr == '&'))) {
LAB_0046f567:
    local_198.content.ptr = (char *)((long)local_198.content.ptr + 1);
    local_198.content.size_ = local_198.content.size_ - 1;
    AVar24 = anon_unknown_0::split(&local_198,local_120);
    sVar15 = AVar24.size_;
    paVar6 = (anon_unknown_0 *)AVar24.ptr;
    if (sVar15 == 0) {
      if (local_19a.allowEmpty == true) {
LAB_0046f5aa:
        bVar21 = false;
        goto LAB_0046f5e5;
      }
    }
    else {
      if (*paVar6 == (anon_unknown_0)0x3d) {
        bVar21 = true;
        pcVar12 = (char *)0x0;
      }
      else {
        pcVar20 = (char *)0x0;
        do {
          bVar22 = (char *)(sVar15 - 1) == pcVar20;
          bVar21 = !bVar22;
          if (bVar22) goto LAB_0046f5aa;
          pcVar12 = pcVar20 + 1;
          paVar1 = paVar6 + 1 + (long)pcVar20;
          pcVar20 = pcVar12;
        } while (*paVar1 != (anon_unknown_0)0x3d);
      }
      AVar24.size_ = sVar15 - (long)(pcVar12 + 1);
      AVar24.ptr = (char *)(paVar6 + (long)pcVar12 + 1);
      paVar10 = paVar6;
      local_140 = pcVar12;
LAB_0046f5e5:
      if (bVar21) {
        text_01.size_ = (size_t)&local_19b;
        text_01.ptr = local_140;
        anon_unknown_0::percentDecodeQuery
                  ((String *)local_188,paVar10,text_01,&local_19a.percentDecode,in_R9);
        text_02.size_ = (size_t)&local_19b;
        text_02.ptr = (char *)AVar24.size_;
        anon_unknown_0::percentDecodeQuery
                  ((String *)local_170,(anon_unknown_0 *)AVar24.ptr,text_02,&local_19a.percentDecode
                   ,in_R9);
        if (local_118.query.builder.pos == local_118.query.builder.endPtr) {
          sVar15 = ((long)local_118.query.builder.endPtr - (long)local_118.query.builder.ptr >> 4) *
                   0x5555555555555556;
          if (local_118.query.builder.endPtr == local_118.query.builder.ptr) {
            sVar15 = 4;
          }
          Vector<kj::Url::QueryParam>::setCapacity(&local_118.query,sVar15);
        }
        ((local_118.query.builder.pos)->name).content.ptr = (char *)local_188._0_8_;
        ((local_118.query.builder.pos)->name).content.size_ = local_188._8_8_;
        ((local_118.query.builder.pos)->name).content.disposer = (ArrayDisposer *)local_188._16_8_;
        local_188._0_8_ = (byte *)0x0;
        local_188._8_8_ = (byte *)0x0;
        ((local_118.query.builder.pos)->value).content.ptr = (char *)local_170;
        ((local_118.query.builder.pos)->value).content.size_ = (size_t)aStack_168.value.content.ptr;
        ((local_118.query.builder.pos)->value).content.disposer =
             (ArrayDisposer *)aStack_168.value.content.size_;
        local_170 = (undefined1  [8])0x0;
        aStack_168.value.content.ptr = (char *)0x0;
        local_118.query.builder.pos = local_118.query.builder.pos + 1;
      }
      else {
        text_03.size_ = (size_t)&local_19b;
        text_03.ptr = (char *)AVar24.size_;
        anon_unknown_0::percentDecodeQuery
                  ((String *)local_188,(anon_unknown_0 *)AVar24.ptr,text_03,&local_19a.percentDecode
                   ,in_R9);
        local_170 = (undefined1  [8])0x0;
        aStack_168.value.content.ptr = (char *)0x0;
        aStack_168.value.content.size_ = 0;
        if (local_118.query.builder.pos == local_118.query.builder.endPtr) {
          sVar15 = ((long)local_118.query.builder.endPtr - (long)local_118.query.builder.ptr >> 4) *
                   0x5555555555555556;
          if (local_118.query.builder.endPtr == local_118.query.builder.ptr) {
            sVar15 = 4;
          }
          Vector<kj::Url::QueryParam>::setCapacity(&local_118.query,sVar15);
        }
        ((local_118.query.builder.pos)->name).content.ptr = (char *)local_188._0_8_;
        ((local_118.query.builder.pos)->name).content.size_ = local_188._8_8_;
        ((local_118.query.builder.pos)->name).content.disposer = (ArrayDisposer *)local_188._16_8_;
        local_188._0_8_ = (byte *)0x0;
        local_188._8_8_ = (byte *)0x0;
        ((local_118.query.builder.pos)->value).content.ptr = (char *)local_170;
        ((local_118.query.builder.pos)->value).content.size_ = (size_t)aStack_168.value.content.ptr;
        ((local_118.query.builder.pos)->value).content.disposer =
             (ArrayDisposer *)aStack_168.value.content.size_;
        local_170 = (undefined1  [8])0x0;
        aStack_168.value.content.ptr = (char *)0x0;
        local_118.query.builder.pos = local_118.query.builder.pos + 1;
      }
    }
  }
LAB_0046f80c:
  pbVar11 = (byte *)(local_198.content.size_ - 1);
  if ((pbVar11 == (byte *)0x0) || (*local_198.content.ptr != '#')) {
    local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
    local_188._16_8_ = " == ";
    local_170 = (undefined1  [8])&DAT_00000005;
    aStack_168._0_1_ = pbVar11 == (byte *)0x0;
    local_188._0_8_ = pbVar11;
    if (pbVar11 != (byte *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                ((Fault *)&local_138,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
                 ,0x10e,FAILED,"text.size() == 0","_kjCondition,",
                 (DebugComparison<unsigned_long,_int> *)local_188);
      kj::_::Debug::Fault::fatal((Fault *)&local_138);
    }
  }
  else {
    if (context != REMOTE_HREF) goto LAB_0046f8ee;
    text_04.ptr = (char *)(local_198.content.size_ - 2);
    text_04.size_ = (size_t)&local_19b;
    anon_unknown_0::percentDecode
              ((String *)local_188,(anon_unknown_0 *)((long)local_198.content.ptr + 1),text_04,
               &local_19a.percentDecode,in_R9);
    uVar5 = local_118.fragment.ptr.field_1.value.content.size_;
    uVar2 = local_118.fragment.ptr.field_1.value.content.ptr;
    if ((local_118.fragment.ptr.isSet == true) &&
       (local_118.fragment.ptr.isSet = false,
       (byte *)local_118.fragment.ptr.field_1.value.content.ptr != (byte *)0x0)) {
      local_118.fragment.ptr.field_1.value.content.ptr = (char *)0x0;
      local_118.fragment.ptr.field_1.value.content.size_ = 0;
      (**(local_118.fragment.ptr.field_1.value.content.disposer)->_vptr_ArrayDisposer)
                (local_118.fragment.ptr.field_1.value.content.disposer,uVar2,1,uVar5,uVar5,0);
    }
    local_118.fragment.ptr.field_1.value.content.ptr = (char *)local_188._0_8_;
    local_118.fragment.ptr.field_1.value.content.size_ = local_188._8_8_;
    local_118.fragment.ptr.field_1.value.content.disposer = (ArrayDisposer *)local_188._16_8_;
    local_118.fragment.ptr.isSet = true;
  }
  pMVar14 = local_148;
  if (local_19b == '\0') {
    (local_148->ptr).isSet = true;
    Url(&(local_148->ptr).field_1.value,&local_118);
    goto LAB_0046f8f6;
  }
LAB_0046f8ee:
  (local_148->ptr).isSet = false;
  pMVar14 = local_148;
LAB_0046f8f6:
  ~Url(&local_118);
  return pMVar14;
}

Assistant:

Maybe<Url> Url::tryParse(StringPtr text, Context context, Options options) {
  Url result;
  result.options = options;
  bool err = false;  // tracks percent-decoding errors

  auto& END_PATH_PART = getEndPathPart(context);
  auto& END_QUERY_PART = getEndQueryPart(context);

  if (context == HTTP_REQUEST) {
    if (!text.startsWith("/")) {
      return kj::none;
    }
  } else {
    KJ_IF_SOME(scheme, trySplit(text, ':')) {
      result.scheme = kj::str(scheme);
    } else {
      // missing scheme
      return kj::none;
    }
    toLower(result.scheme);
    if (result.scheme.size() == 0 ||
        !ALPHAS.contains(result.scheme[0]) ||
        !SCHEME_CHARS.containsAll(result.scheme.slice(1))) {
      // bad scheme
      return kj::none;
    }

    if (!text.startsWith("//")) {
      // We require an authority (hostname) part.
      return kj::none;
    }
    text = text.slice(2);

    {
      auto authority = split(text, END_AUTHORITY);

      KJ_IF_SOME(userpass, trySplit(authority, '@')) {
        if (context != REMOTE_HREF) {
          // No user/pass allowed here.
          return kj::none;
        }
        KJ_IF_SOME(username, trySplit(userpass, ':')) {
          result.userInfo = UserInfo {
            percentDecode(username, err, options),
            percentDecode(userpass, err, options)
          };
        } else {
          result.userInfo = UserInfo {
            percentDecode(userpass, err, options),
            kj::none
          };
        }
      }

      result.host = percentDecode(authority, err, options);
      if (!HOST_CHARS.containsAll(result.host)) return kj::none;
      toLower(result.host);
    }